

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O3

void __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::
set_verify_mode(stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *this,
               verify_mode v)

{
  error_code __ec;
  error_code ec;
  error_code local_48;
  system_error local_38 [32];
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  set_verify_mode(this,v,&local_48);
  __ec._4_4_ = 0;
  __ec._M_value = local_48._M_value;
  if (local_48._M_value != 0) {
    __ec._M_cat = local_48._M_cat;
    std::system_error::system_error(local_38,__ec,"set_verify_mode");
    asio::detail::throw_exception<std::system_error>(local_38);
    std::system_error::~system_error(local_38);
  }
  return;
}

Assistant:

void set_verify_mode(verify_mode v)
  {
    asio::error_code ec;
    set_verify_mode(v, ec);
    asio::detail::throw_error(ec, "set_verify_mode");
  }